

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive.h
# Opt level: O0

bool __thiscall
acto::intrusive::queue<acto::core::object_t,_acto::intrusive::spin_lock>::empty
          (queue<acto::core::object_t,_acto::intrusive::spin_lock> *this)

{
  object_t *poVar1;
  lock_guard<acto::intrusive::spin_lock> local_18;
  lock_guard<acto::intrusive::spin_lock> g;
  queue<acto::core::object_t,_acto::intrusive::spin_lock> *this_local;
  
  g._M_device = (mutex_type *)this;
  std::lock_guard<acto::intrusive::spin_lock>::lock_guard(&local_18,&this->mutex_);
  poVar1 = this->tail_;
  std::lock_guard<acto::intrusive::spin_lock>::~lock_guard(&local_18);
  return poVar1 == (object_t *)0x0;
}

Assistant:

bool empty() const {
    std::lock_guard g(mutex_);

    return tail_ == nullptr;
  }